

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paladin.c
# Opt level: O0

void spell_blinding_orb(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  CHAR_DATA *in_RDX;
  char buf2 [4608];
  int b_duration;
  int b_hitroll;
  int duration;
  int hitroll;
  int dam;
  AFFECT_DATA af;
  CHAR_DATA *vch_next;
  CHAR_DATA *victim;
  undefined4 in_stack_ffffffffffffed18;
  int in_stack_ffffffffffffed1c;
  int in_stack_ffffffffffffed20;
  int in_stack_ffffffffffffed24;
  undefined4 in_stack_ffffffffffffed28;
  undefined4 in_stack_ffffffffffffed2c;
  CHAR_DATA *in_stack_ffffffffffffed30;
  char local_12b8 [12];
  int in_stack_ffffffffffffed54;
  CHAR_DATA *in_stack_ffffffffffffed58;
  int in_stack_ffffffffffffed60;
  CHAR_DATA *local_28;
  
  act((char *)in_stack_ffffffffffffed30,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),
      (void *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
      (void *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),0);
  act((char *)in_stack_ffffffffffffed30,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),
      (void *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
      (void *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),0);
  pCVar1 = in_RDX->in_room->people;
LAB_00764ae7:
  do {
    do {
      local_28 = pCVar1;
      if (local_28 == (CHAR_DATA *)0x0) {
        return;
      }
      pCVar1 = local_28->next_in_room;
      bVar2 = is_same_group(in_RDX,local_28);
    } while (((bVar2) || (bVar2 = is_same_cabal(in_RDX,local_28), bVar2)) ||
            (bVar2 = is_safe((CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18)), bVar2))
    ;
    dice(in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
    bVar2 = is_good((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
    if (bVar2) goto LAB_00764b9d;
    bVar2 = is_neutral((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
  } while ((bVar2) && (iVar3 = number_percent(), 0x4b < iVar3));
  goto LAB_00764c7e;
LAB_00764b9d:
  iVar3 = number_percent();
  if (iVar3 < 0x1a) {
LAB_00764c7e:
    pcVar4 = pers((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20));
    sprintf(local_12b8,"Die, %s, you sorcerous dog!",pcVar4);
    if ((local_28->fighting == (CHAR_DATA *)0x0) &&
       (bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18)),
       !bVar2)) {
      do_myell(in_stack_ffffffffffffed30,
               (char *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),
               (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20));
    }
    in_stack_ffffffffffffed18 = 0;
    in_stack_ffffffffffffed20 = 0;
    in_stack_ffffffffffffed28 = 1;
    in_stack_ffffffffffffed30 = (CHAR_DATA *)0x0;
    damage_new((CHAR_DATA *)buf2._120_8_,(CHAR_DATA *)buf2._112_8_,buf2._108_4_,buf2._104_4_,
               buf2._100_4_,(bool)buf2[99],(bool)buf2[0x62],buf2._152_4_,buf2._160_4_,
               (char *)buf2._168_8_);
    bVar2 = saves_spell(in_stack_ffffffffffffed60,in_stack_ffffffffffffed58,
                        in_stack_ffffffffffffed54);
    if ((!bVar2) &&
       (bVar2 = is_affected_by((CHAR_DATA *)
                               CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),
                               in_stack_ffffffffffffed24), !bVar2)) {
      act((char *)in_stack_ffffffffffffed30,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),
          (void *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
          (void *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),0);
      act((char *)in_stack_ffffffffffffed30,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),
          (void *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
          (void *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),0);
      init_affect((AFFECT_DATA *)0x764dd6);
      std::pow<int,int>(0,0x764e2e);
      affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed24,in_stack_ffffffffffffed20),
                     (AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18));
    }
  }
  goto LAB_00764ae7;
}

Assistant:

void spell_blinding_orb(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo, *vch_next;
	AFFECT_DATA af;
	int dam, hitroll, duration, b_hitroll, b_duration;

	act("You bring forth an orb of blinding light to sear the eyes of your foes!", ch, 0, 0, TO_CHAR);
	act("$n calls forth a brilliant orb of radiant light!", ch, 0, 0, TO_ROOM);

	for (victim = ch->in_room->people; victim != nullptr; victim = vch_next)
	{
		vch_next = victim->next_in_room;

		if (is_same_group(ch, victim) || is_same_cabal(ch, victim) || is_safe(ch, victim))
			continue;

		dam = dice(level, 2);

		b_hitroll = -4;
		b_duration = 1;

		if (is_good(victim))
		{
			if (number_percent() > 25)
				continue;

			dam /= 3;
			hitroll = b_hitroll;
			duration = b_duration;
		}
		else if (is_neutral(victim))
		{
			if (number_percent() > 75)
				continue;

			dam /= 2;
			hitroll = b_hitroll * 2;
			duration = b_duration * 3;
		}
		else
		{
			dam = (int)(dam * 1.5);
			hitroll = b_hitroll * 4;
			duration = b_duration * 6;
		}

		char buf2[MSL];
		sprintf(buf2, "Die, %s, you sorcerous dog!", pers(ch, victim));

		if (!victim->fighting && !is_npc(victim))
			do_myell(victim, buf2, ch);

		damage_new(ch, victim, dam, sn, DAM_LIGHT, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);

		if (!saves_spell(ch->level, victim, DAM_LIGHT) && !is_affected_by(victim, AFF_BLIND))
		{
			act("$n falters as the light sears $s eyes.", victim, 0, ch, TO_ROOM);
			act("You are blinded by the bright light!", ch, 0, victim, TO_VICT);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.type = sn;
			af.aftype = AFT_COMMUNE;
			af.level = level;
			af.location = APPLY_HITROLL;
			af.modifier = hitroll;
			SET_BIT(af.bitvector, AFF_BLIND);
			af.duration = duration;
			af.mod_name = MOD_VISION;
			affect_to_char(victim, &af);
		}
	}
}